

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

tests * lest::make_tests<lest::test[3]>(tests *__return_storage_ptr__,test (*c) [3])

{
  tests local_28;
  
  make_tests(&local_28,*c,c[1]);
  (__return_storage_ptr__->super__Vector_base<lest::test,_std::allocator<lest::test>_>)._M_impl.
  super__Vector_impl_data._M_start =
       local_28.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->super__Vector_base<lest::test,_std::allocator<lest::test>_>)._M_impl.
  super__Vector_impl_data._M_finish =
       local_28.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->super__Vector_base<lest::test,_std::allocator<lest::test>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_28.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_28.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<lest::test,_std::allocator<lest::test>_>::~vector(&local_28);
  return __return_storage_ptr__;
}

Assistant:

tests make_tests( C const & c ) { return make_tests( test_begin( c ), test_end( c ) ); }